

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teststop.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  float fVar1;
  float fVar2;
  undefined8 extraout_RAX;
  int iVar3;
  sclock_t diff;
  sclock_t start;
  SystemClock<(ClockType)2> clock;
  SystemClock<(ClockType)2> local_30;
  
  SystemClock<(ClockType)2>::SystemClock(&local_30,0);
  Clock::getResolution(&local_30.super_Clock);
  fVar2 = 0.0;
  iVar3 = 100000;
  do {
    local_30.thread_data.stopped = true;
    fVar1 = (local_30.thread_data.clock)->a;
    usleep(1000);
    local_30.thread_data.stopped = false;
    fVar2 = fVar2 + ((local_30.thread_data.clock)->a - fVar1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  if (fVar2 / 100000.0 <= 0.0001) {
    main_cold_1();
    return 0;
  }
  main_cold_2();
  SystemClock<(ClockType)2>::~SystemClock(&local_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int 
main( int argc, char **argv )
{
   SystemClock< System > clock( 0 /** core zero **/ );   
   const auto resolution( clock.getResolution() );
   const auto microseconds( 1000 );
   const auto num_iterations( 1e5 );
   double diff_accum( 0.0 );
   for( auto iterations( 0 ); iterations < num_iterations; iterations++ )
   {
      volatile auto start( clock.stop() );
      usleep( (useconds_t) microseconds );
      volatile const auto diff( clock.start() - start );
      diff_accum += diff;
   }
   const double average( diff_accum / num_iterations );
   const double tenperc( .001 /** microseconds **/ * .10 );
   if( std::isgreater( average, tenperc ) )
   {
      std::fprintf( stderr, 
                    "%.20f is greater than 10 percent (100 microseconds) of measured time.", 
                    average );
      std::exit( EXIT_FAILURE );
   }
   const double actual_fraction( ( average / .001 ) * 100 );
   //print out the actual fraction of time we're off
   std::fprintf( stderr, "%.20f\n", actual_fraction );
   /** else return success **/
   return( EXIT_SUCCESS );
}